

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

void __thiscall chrono::ChOptimizer::ChOptimizer(ChOptimizer *this,ChOptimizer *other)

{
  this->_vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizer_00b62750;
  strcpy(this->err_message,other->err_message);
  this->minimize = other->minimize;
  this->error_code = other->error_code;
  this->fx_evaluations = other->fx_evaluations;
  this->grad_evaluations = other->grad_evaluations;
  this->grad_step = other->grad_step;
  this->C_vars = other->C_vars;
  this->xv = other->xv;
  this->xv_sup = other->xv_sup;
  this->xv_inf = other->xv_inf;
  this->break_funct = other->break_funct;
  this->break_cycles = other->break_cycles;
  this->break_cyclecounter = other->break_cyclecounter;
  this->user_break = other->user_break;
  return;
}

Assistant:

ChOptimizer::ChOptimizer(const ChOptimizer& other) {
    // copy error message
    strcpy(err_message, other.err_message);

    minimize = other.minimize;
    error_code = other.error_code;
    fx_evaluations = other.fx_evaluations;
    grad_evaluations = other.grad_evaluations;
    grad_step = other.grad_step;
    C_vars = other.C_vars;

    xv = other.xv;
    xv_sup = other.xv_sup;
    xv_inf = other.xv_inf;

    break_funct = other.break_funct;
    break_cycles = other.break_cycles;
    break_cyclecounter = other.break_cyclecounter;
    user_break = other.user_break;
}